

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uint64_t pull_le64(uchar **cursor,size_t *max)

{
  uint64_t uVar1;
  leint64_t local_20;
  leint64_t lev;
  size_t *max_local;
  uchar **cursor_local;
  
  lev = (leint64_t)max;
  max_local = (size_t *)cursor;
  pull_bytes(&local_20,8,cursor,max);
  uVar1 = le64_to_cpu(local_20);
  return uVar1;
}

Assistant:

uint64_t pull_le64(const unsigned char **cursor, size_t *max)
{
    leint64_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le64_to_cpu(lev);
}